

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
::TestBody(InsertHint<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
           *this)

{
  anon_union_8_1_a8a14541_for_iterator_1 aVar1;
  result_type_conflict1 rVar2;
  mt19937_64 *__urng;
  pointer *__ptr_1;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  T val2;
  T val;
  TypeParam m;
  AssertHelper local_108;
  AssertHelper local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  undefined1 local_f0 [8];
  anon_union_8_1_a8a14541_for_iterator_1 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [8];
  anon_union_8_1_a8a14541_for_iterator_1 local_c8;
  undefined1 local_c0 [24];
  result_type_conflict1 local_a8;
  AssertHelper local_a0;
  pair<const_phmap::priv::NonStandardLayout,_int> local_98;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_68;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_98,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)&local_68);
  local_68.size_ = 0;
  local_68.capacity_ = 0;
  local_68.ctrl_ = (ctrl_t *)0x0;
  local_68.slots_ = (slot_type *)0x0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_false>
  ._M_head_impl.id_ =
       (_Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_false>
        )(Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>)0x0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (StatefulTestingEqual)
       (StatefulTestingEqual)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (StatefulTestingHash)
       (StatefulTestingHash)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::emplace<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
              *)local_d0,&local_68,&local_98);
  aVar1 = local_c8;
  local_f0[0] = (internal)(local_d0 != (undefined1  [8])(local_68.ctrl_ + local_68.capacity_));
  local_e8.slot_ = (slot_type *)0x0;
  if (local_d0 == (undefined1  [8])(local_68.ctrl_ + local_68.capacity_)) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_f0,(AssertionResult *)"it != m.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x47,(char *)local_d0);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_d0 != (undefined1  [8])(local_d0 + 0x10)) {
      operator_delete((void *)local_d0,local_c0._0_8_ + 1);
    }
    if ((long *)CONCAT71(local_100.data_._1_7_,local_100.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_100.data_._1_7_,local_100.data_._0_1_) + 8))();
    }
  }
  if (local_e8.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8.slot_
                );
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_d0,"val","*it",&local_98,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)aVar1.slot_);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_c8.slot_ == (slot_type *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((param_type)local_f0 != (param_type)0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  if (local_c8.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_d0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8.slot_
                );
  }
  local_f0._0_4_ = 0;
  local_f0._4_4_ = 0x7fffffff;
  __urng = hash_internal::GetSharedRng();
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)local_f0,__urng,(param_type *)local_f0);
  local_d0 = (undefined1  [8])&PTR__NonStandardLayout_0032a340;
  local_c8.slot_ = (slot_type *)(local_c0 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_d0 + 8),local_98.first.value._M_dataplus._M_p,
             local_98.first.value._M_dataplus._M_p + local_98.first.value._M_string_length);
  local_a8 = rVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::emplace<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
              *)local_f0,&local_68,(pair<const_phmap::priv::NonStandardLayout,_int> *)local_d0);
  aVar1 = local_e8;
  local_100.data_._0_1_ =
       (internal)(local_f0 != (undefined1  [8])(local_68.ctrl_ + local_68.capacity_));
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_100.data_._0_1_) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)&local_100,(AssertionResult *)"it != m.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4b,(char *)local_f0);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_f0 != (undefined1  [8])((long)local_f0 + 0x10)) {
      operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
    }
    if (local_108.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_108.data_ + 8))();
    }
  }
  if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,local_f8);
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_f0,"val","*it",&local_98,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)aVar1.slot_);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8.slot_ == (slot_type *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_e8.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((long *)CONCAT71(local_100.data_._1_7_,local_100.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_100.data_._1_7_,local_100.data_._0_1_) + 8))();
    }
  }
  if (local_e8.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8.slot_
                );
  }
  local_d0 = (undefined1  [8])&PTR__NonStandardLayout_0032a340;
  if (local_c8.slot_ != (slot_type *)(local_c0 + 8)) {
    operator_delete(local_c8.slot_,local_c0._8_8_ + 1);
  }
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::destroy_slots(&local_68);
  local_98.first._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_0032a340;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first.value._M_dataplus._M_p != &local_98.first.value.field_2) {
    operator_delete(local_98.first.value._M_dataplus._M_p,
                    local_98.first.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.insert(it, val2);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}